

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

InlineeFrameRecord * __thiscall
Js::EntryPointInfo::FindInlineeFrame(EntryPointInfo *this,void *returnAddress)

{
  uint uVar1;
  bool bVar2;
  int in_EAX;
  InProcNativeEntryPointData *this_00;
  InlineeFrameMap *this_01;
  DWORD_PTR DVar3;
  NativeOffsetInlineeFramePair *pNVar4;
  Type *pTVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int local_38;
  int local_34;
  
  this_00 = (InProcNativeEntryPointData *)GetNativeEntryPointData(this);
  this_01 = InProcNativeEntryPointData::GetInlineeFrameMap(this_00);
  if (this_01 != (InlineeFrameMap *)0x0) {
    DVar3 = GetNativeAddress(this);
    uVar6 = (long)returnAddress - DVar3;
    local_34 = (this_01->
               super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
               ).count + -1;
    iVar8 = 0;
    local_38 = in_EAX;
    do {
      if (local_34 < iVar8) {
        local_38 = -1;
        break;
      }
      iVar7 = (local_34 - iVar8) / 2;
      pNVar4 = JsUtil::
               ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>::
               Item(&this_01->
                     super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
                    ,iVar7 + iVar8);
      uVar1 = pNVar4->offset;
      iVar7 = iVar7 + iVar8;
      if (((iVar7 == 0) || (uVar1 < uVar6)) ||
         ((0 < iVar7 &&
          (pTVar5 = JsUtil::
                    List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this_01,iVar7 + -1), pTVar5->offset < uVar6)))) {
        if (uVar1 < uVar6) {
          iVar8 = iVar7 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          local_38 = iVar7;
        }
      }
      else {
        local_34 = iVar7 + -1;
        bVar2 = true;
      }
    } while (bVar2);
    if (local_38 != -1) {
      pTVar5 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,local_38);
      return pTVar5->record;
    }
  }
  return (InlineeFrameRecord *)0x0;
}

Assistant:

InlineeFrameRecord* EntryPointInfo::FindInlineeFrame(void* returnAddress)
    {
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled())  // OOP JIT
        {
            OOPNativeEntryPointData * oopNativeEntryPointData = this->GetOOPNativeEntryPointData();
            char * nativeDataBuffer = oopNativeEntryPointData->GetNativeDataBuffer();
            NativeOffsetInlineeFrameRecordOffset* offsets = (NativeOffsetInlineeFrameRecordOffset*)(nativeDataBuffer + oopNativeEntryPointData->GetInlineeFrameOffsetArrayOffset());
            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());

            uint inlineeFrameOffsetArrayCount = oopNativeEntryPointData->GetInlineeFrameOffsetArrayCount();
            if (inlineeFrameOffsetArrayCount == 0)
            {
                return nullptr;
            }

            uint fromIndex = 0;
            uint toIndex = inlineeFrameOffsetArrayCount - 1;
            while (fromIndex <= toIndex)
            {
                uint midIndex = fromIndex + (toIndex - fromIndex) / 2;
                auto item = offsets[midIndex];

                if (item.offset >= offset)
                {
                    if (midIndex == 0 || (midIndex > 0 && offsets[midIndex - 1].offset < offset))
                    {
                        if (offsets[midIndex].recordOffset == NativeOffsetInlineeFrameRecordOffset::InvalidRecordOffset)
                        {
                            return nullptr;
                        }
                        else
                        {
                            return (InlineeFrameRecord*)(nativeDataBuffer + offsets[midIndex].recordOffset);
                        }
                    }
                    else
                    {
                        toIndex = midIndex - 1;
                    }
                }
                else
                {
                    fromIndex = midIndex + 1;
                }
            }
            return nullptr;
        }
        else
#endif
        // in-proc JIT
        {
            InlineeFrameMap * inlineeFrameMap = this->GetInProcNativeEntryPointData()->GetInlineeFrameMap();
            if (inlineeFrameMap == nullptr)
            {
                return nullptr;
            }

            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());
            int index = inlineeFrameMap->BinarySearch([=](const NativeOffsetInlineeFramePair& pair, int index) {
                if (pair.offset >= offset)
                {
                    if (index == 0 || (index > 0 && inlineeFrameMap->Item(index - 1).offset < offset))
                    {
                        return 0;
                    }
                    else
                    {
                        return 1;
                    }
                }
                return -1;
            });

            if (index == -1)
            {
                return nullptr;
            }
            return inlineeFrameMap->Item(index).record;
        }

    }